

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O3

lws_mqtt_str_t * lws_mqtt_str_create_cstr_dup(char *buf,uint16_t lim)

{
  size_t sVar1;
  lws_mqtt_str_t *plVar2;
  uint16_t uVar3;
  uint16_t lim_00;
  int iVar4;
  undefined6 in_register_00000032;
  
  sVar1 = strlen(buf);
  iVar4 = (int)CONCAT62(in_register_00000032,lim);
  if (iVar4 == 0) {
    iVar4 = (int)sVar1;
  }
  uVar3 = (uint16_t)sVar1;
  lim_00 = (uint16_t)iVar4;
  if ((uint16_t)iVar4 == 0) {
    lim_00 = uVar3;
  }
  plVar2 = lws_mqtt_str_create(lim_00);
  if (plVar2 != (lws_mqtt_str_t *)0x0) {
    memcpy(plVar2->buf,buf,sVar1 & 0xffff);
    plVar2->len = uVar3;
    plVar2->len_valid = '\x01';
    plVar2->pos = uVar3;
  }
  return plVar2;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create_cstr_dup(const char *buf, uint16_t lim)
{
	int len = strlen(buf);

	if (!lim)
		lim = len;

	return lws_mqtt_str_create_init((uint8_t *)buf, len, lim);
}